

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# caffe.pb.cc
# Opt level: O1

ImageDataParameter * __thiscall
caffe::ImageDataParameter::New(ImageDataParameter *this,Arena *arena)

{
  ImageDataParameter *this_00;
  
  this_00 = (ImageDataParameter *)operator_new(0x50);
  ImageDataParameter(this_00);
  if (arena != (Arena *)0x0) {
    google::protobuf::Arena::Own<caffe::ImageDataParameter>(arena,this_00);
  }
  return this_00;
}

Assistant:

ImageDataParameter* ImageDataParameter::New(::google::protobuf::Arena* arena) const {
  ImageDataParameter* n = new ImageDataParameter;
  if (arena != NULL) {
    arena->Own(n);
  }
  return n;
}